

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O0

int uv_if_indextoname(uint ifindex,char *buffer,size_t *size)

{
  char *pcVar1;
  int *piVar2;
  size_t __n;
  size_t len;
  char ifname_buf [17];
  size_t *size_local;
  char *buffer_local;
  uint ifindex_local;
  
  if (((buffer == (char *)0x0) || (size == (size_t *)0x0)) || (*size == 0)) {
    buffer_local._4_4_ = -0x16;
  }
  else {
    unique0x100000a3 = size;
    pcVar1 = if_indextoname(ifindex,(char *)&len);
    if (pcVar1 == (char *)0x0) {
      piVar2 = __errno_location();
      buffer_local._4_4_ = -*piVar2;
    }
    else {
      __n = strnlen((char *)&len,0x11);
      if (__n < *stack0xffffffffffffffe0) {
        memcpy(buffer,&len,__n);
        buffer[__n] = '\0';
        *stack0xffffffffffffffe0 = __n;
        buffer_local._4_4_ = 0;
      }
      else {
        *stack0xffffffffffffffe0 = __n + 1;
        buffer_local._4_4_ = -0x69;
      }
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_if_indextoname(unsigned int ifindex, char* buffer, size_t* size) {
  char ifname_buf[UV_IF_NAMESIZE];
  size_t len;

  if (buffer == NULL || size == NULL || *size == 0)
    return UV_EINVAL;

  if (if_indextoname(ifindex, ifname_buf) == NULL)
    return UV__ERR(errno);

  len = strnlen(ifname_buf, sizeof(ifname_buf));

  if (*size <= len) {
    *size = len + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, ifname_buf, len);
  buffer[len] = '\0';
  *size = len;

  return 0;
}